

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float32_muladd_riscv64(float32 xa,float32 xb,float32 xc,int flags,float_status *s)

{
  float32 fVar1;
  ulong uVar2;
  float fVar3;
  float __z;
  union_float32 uc;
  union_float32 ub;
  union_float32 ua;
  float local_3c;
  float32 local_38;
  float local_34;
  
  uVar2 = (ulong)xb;
  local_3c = (float)xc;
  local_38 = xb;
  local_34 = (float)xa;
  if ((((s->float_exception_flags & 0x20) != 0) && ((flags & 8U) == 0)) &&
     (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      float32_input_flush__nocheck((float32 *)&local_34,s);
      float32_input_flush__nocheck(&local_38,s);
      float32_input_flush__nocheck((float32 *)&local_3c,s);
      uVar2 = (ulong)local_38;
    }
    xa = (float32)local_34;
    xc = (float32)local_3c;
    xb = (float32)uVar2;
    if ((((ABS(local_34) == 0.0) || ((((uint)local_34 >> 0x17) + 1 & 0xfe) != 0)) &&
        (((uVar2 & 0x7fffffff) == 0 || (((int)(uVar2 >> 0x17) + 1U & 0xfe) != 0)))) &&
       ((ABS(local_3c) == 0.0 || ((((uint)local_3c >> 0x17) + 1 & 0xfe) != 0)))) {
      if (ABS(local_34) == 0.0 || (uVar2 & 0x7fffffff) == 0) {
        if ((flags & 1U) != 0) {
          local_3c = (float)((uint)local_3c ^ (uint)DAT_00b66fd0);
        }
        if (SUB41((flags & 2U) >> 1,0) == (int)(xb ^ (uint)local_34) < 0) {
          fVar3 = 0.0;
        }
        else {
          fVar3 = -0.0;
        }
        fVar3 = fVar3 + local_3c;
      }
      else {
        fVar3 = local_34;
        if ((flags & 2U) != 0) {
          fVar3 = -local_34;
        }
        __z = local_3c;
        if ((flags & 1U) != 0) {
          __z = -local_3c;
        }
        fVar3 = fmaf(fVar3,(float)xb,__z);
        if (ABS(fVar3) == INFINITY) {
          s->float_exception_flags = s->float_exception_flags | 8;
        }
        else if ((float)((uint)fVar3 & (uint)DAT_00b66fb0) <= 1.1754944e-38) goto LAB_00a7e6ca;
      }
      if ((flags & 4U) != 0) {
        fVar3 = (float)((uint)fVar3 ^ (uint)DAT_00b66fd0);
      }
      return (float32)fVar3;
    }
  }
LAB_00a7e6ca:
  fVar1 = soft_f32_muladd(xa,xb,xc,flags,s);
  return fVar1;
}

Assistant:

float32 QEMU_FLATTEN
float32_muladd(float32 xa, float32 xb, float32 xc, int flags, float_status *s)
{
    union_float32 ua, ub, uc, ur;

    ua.s = xa;
    ub.s = xb;
    uc.s = xc;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }
    if (unlikely(flags & float_muladd_halve_result)) {
        goto soft;
    }

    float32_input_flush3(&ua.s, &ub.s, &uc.s, s);
    if (unlikely(!f32_is_zon3(ua, ub, uc))) {
        goto soft;
    }

    if (unlikely(force_soft_fma)) {
        goto soft;
    }

    /*
     * When (a || b) == 0, there's no need to check for under/over flow,
     * since we know the addend is (normal || 0) and the product is 0.
     */
    if (float32_is_zero(ua.s) || float32_is_zero(ub.s)) {
        union_float32 up;
        bool prod_sign;

        prod_sign = float32_is_neg(ua.s) ^ float32_is_neg(ub.s);
        prod_sign ^= !!(flags & float_muladd_negate_product);
        up.s = float32_set_sign(float32_zero, prod_sign);

        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }
        ur.h = up.h + uc.h;
    } else {
        union_float32 ua_orig = ua;
        union_float32 uc_orig = uc;

        if (flags & float_muladd_negate_product) {
            ua.h = -ua.h;
        }
        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }

        ur.h = fmaf(ua.h, ub.h, uc.h);

        if (unlikely(f32_is_inf(ur))) {
            s->float_exception_flags |= float_flag_overflow;
        } else if (unlikely(fabsf(ur.h) <= FLT_MIN)) {
            ua = ua_orig;
            uc = uc_orig;
            goto soft;
        }
    }
    if (flags & float_muladd_negate_result) {
        return float32_chs(ur.s);
    }
    return ur.s;

 soft:
    return soft_f32_muladd(ua.s, ub.s, uc.s, flags, s);
}